

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void unloadtags(void)

{
  tagtree *ptVar1;
  ctag *pcVar2;
  ctag *elm;
  
  ptVar1 = &tags;
  pcVar2 = (ctag *)0x0;
  do {
    elm = pcVar2;
    ptVar1 = (tagtree *)(((ctag *)ptVar1)->entry).rbe_left;
    pcVar2 = (ctag *)ptVar1;
  } while ((ctag *)ptVar1 != (ctag *)0x0);
  while (elm != (ctag *)0x0) {
    pcVar2 = tagtree_RB_NEXT(elm);
    tagtree_RB_REMOVE(&tags,elm);
    free(elm->tag);
    free(elm);
    elm = pcVar2;
  }
  return;
}

Assistant:

void
unloadtags(void)
{
	struct ctag *var, *nxt;

	for (var = RB_MIN(tagtree, &tags); var != NULL; var = nxt) {
		nxt = RB_NEXT(tagtree, &tags, var);
		RB_REMOVE(tagtree, &tags, var);
		/* line parsed with fparseln needs to be freed */
		free(var->tag);
		free(var);
	}
}